

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.c
# Opt level: O3

double inform_bin(double *series,size_t n,int b,int *binned,inform_error *err)

{
  double dVar1;
  double dVar2;
  inform_error iVar3;
  uint uVar4;
  size_t sVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  double dVar8;
  double dVar9;
  double local_48;
  
  if (series == (double *)0x0) {
LAB_0015d2e1:
    iVar3 = INFORM_ETIMESERIES;
  }
  else if (n == 0) {
    iVar3 = INFORM_ESHORTSERIES;
  }
  else {
    if (1 < b) {
      if (binned != (int *)0x0) {
        dVar8 = *series;
        uVar6 = SUB84(dVar8,0);
        uVar7 = (undefined4)((ulong)dVar8 >> 0x20);
        dVar9 = dVar8;
        if (n != 1) {
          sVar5 = 1;
          do {
            dVar9 = series[sVar5];
            dVar1 = dVar9;
            if (dVar8 <= dVar9) {
              dVar1 = dVar8;
            }
            dVar8 = dVar1;
            if (dVar9 <= (double)CONCAT44(uVar7,uVar6)) {
              dVar9 = (double)CONCAT44(uVar7,uVar6);
            }
            sVar5 = sVar5 + 1;
            uVar6 = SUB84(dVar9,0);
            uVar7 = (undefined4)((ulong)dVar9 >> 0x20);
          } while (n != sVar5);
        }
        local_48 = (dVar9 - dVar8) / (double)b;
        if (2.220446049250313e-15 < local_48) {
          sVar5 = 0;
          do {
            dVar1 = series[sVar5];
            dVar2 = floor((dVar1 - dVar8) / local_48);
            uVar4 = (int)dVar2 - (uint)(dVar1 == dVar9);
            binned[sVar5] = uVar4;
            if ((uint)b <= uVar4) {
              __assert_fail("0 <= binned[i] && binned[i] < b",
                            "/workspace/llm4binary/github/license_c_cmakelists/ELIFE-ASU[P]Inform/src/utilities/binning.c"
                            ,0x36,
                            "double inform_bin(const double *, size_t, int, int *, inform_error *)")
              ;
            }
            sVar5 = sVar5 + 1;
          } while (n != sVar5);
          return local_48;
        }
        memset(binned,0,n << 2);
        iVar3 = INFORM_EBIN;
        goto LAB_0015d2ef;
      }
      goto LAB_0015d2e1;
    }
    iVar3 = INFORM_EBIN;
  }
  local_48 = 0.0;
LAB_0015d2ef:
  if (err != (inform_error *)0x0) {
    *err = iVar3;
  }
  return local_48;
}

Assistant:

double inform_bin(double const *series, size_t n, int b, int *binned,
    inform_error *err)
{
    if (series == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0.0);
    else if (n == 0)
        INFORM_ERROR_RETURN(err, INFORM_ESHORTSERIES, 0.0);
    else if (b < 2)
        INFORM_ERROR_RETURN(err, INFORM_EBIN, 0.0);
    else if (binned == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0.0);

    double min, max;
    double range = inform_range(series, n, &min, &max, err);
    double step = range / b;

    if (step <= 10.*DBL_EPSILON)
    {
        memset(binned, 0, n*sizeof(int));
        INFORM_ERROR_RETURN(err, INFORM_EBIN, step);
    }

    for (size_t i = 0; i < n; ++i)
    {
        binned[i] = (int) floor((series[i] - min) / step) - (series[i] == max);
        assert(0 <= binned[i] && binned[i] < b);
    }

    return step;
}